

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfileio.c
# Opt level: O2

int find_quote(char **string)

{
  char cVar1;
  char *pcVar2;
  char *pcVar3;
  
  pcVar3 = *string;
  do {
    pcVar2 = pcVar3 + 1;
    cVar1 = *pcVar3;
    if (cVar1 == '\0') {
      return 1;
    }
    pcVar3 = pcVar2;
  } while (cVar1 != '\'');
  *string = pcVar2;
  return 0;
}

Assistant:

static int find_quote(char **string)

/*  
    look for the closing single quote character in the input string
*/
{
    char *tstr;

    tstr = *string;

    while (*tstr) {
        if (*tstr == '\'') { /* found the closing quote */
           *string = tstr + 1;  /* set pointer to next char */
           return(0); 
        } else {  /* skip over any other character */
           tstr++;
        }
    }
    return(1);  /* opps, didn't find the closing character */
}